

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

SchnorrSignResponse * __thiscall
cfd::js::api::json::SchnorrSignResponse::GetHexString_abi_cxx11_
          (SchnorrSignResponse *this,SchnorrSignResponse *obj)

{
  SchnorrSignResponse *obj_local;
  
  core::ConvertToString<std::__cxx11::string>((core *)this,&obj->hex_);
  return this;
}

Assistant:

static std::string GetHexString(  // line separate
      const SchnorrSignResponse& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.hex_);
  }